

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::HostAddress::HostAddress(HostAddress *this,string *address)

{
  bool bVar1;
  
  this->m_protocol = UnknownNetworkProtocol;
  this->m_ip4Address = 0;
  (this->m_ip6Address).data[0] = '\0';
  (this->m_ip6Address).data[1] = '\0';
  (this->m_ip6Address).data[2] = '\0';
  (this->m_ip6Address).data[3] = '\0';
  (this->m_ip6Address).data[4] = '\0';
  (this->m_ip6Address).data[5] = '\0';
  (this->m_ip6Address).data[6] = '\0';
  (this->m_ip6Address).data[7] = '\0';
  (this->m_ip6Address).data[8] = '\0';
  (this->m_ip6Address).data[9] = '\0';
  (this->m_ip6Address).data[10] = '\0';
  (this->m_ip6Address).data[0xb] = '\0';
  (this->m_ip6Address).data[0xc] = '\0';
  (this->m_ip6Address).data[0xd] = '\0';
  (this->m_ip6Address).data[0xe] = '\0';
  (this->m_ip6Address).data[0xf] = '\0';
  (this->m_ipString)._M_dataplus._M_p = (pointer)&(this->m_ipString).field_2;
  (this->m_ipString)._M_string_length = 0;
  (this->m_ipString).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->m_ipString);
  bVar1 = ParseAddress(this);
  this->m_hasIpAddress = bVar1;
  return;
}

Assistant:

HostAddress::HostAddress(const std::string& address)
    : m_protocol(HostAddress::UnknownNetworkProtocol)
    , m_ip4Address(0)
{
    SetAddress(address);
}